

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::Embed::~Embed(Embed *this)

{
  _Head_base<0UL,_discordpp::EmbedAuthor_*,_false> __ptr;
  _Head_base<0UL,_discordpp::EmbedProvider_*,_false> __ptr_00;
  _Head_base<0UL,_discordpp::EmbedVideo_*,_false> __ptr_01;
  _Head_base<0UL,_discordpp::EmbedThumbnail_*,_false> __ptr_02;
  _Head_base<0UL,_discordpp::EmbedImage_*,_false> __ptr_03;
  _Head_base<0UL,_discordpp::EmbedFooter_*,_false> __ptr_04;
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  
  std::
  unique_ptr<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>,_std::default_delete<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>_>
  ::~unique_ptr(&(this->fields).
                 super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
                 .t_);
  __ptr._M_head_impl =
       (this->author).super_field<discordpp::EmbedAuthor>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedAuthor,_std::default_delete<discordpp::EmbedAuthor>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedAuthor_*,_std::default_delete<discordpp::EmbedAuthor>_>
       .super__Head_base<0UL,_discordpp::EmbedAuthor_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (EmbedAuthor *)0x0) {
    std::default_delete<discordpp::EmbedAuthor>::operator()
              ((default_delete<discordpp::EmbedAuthor> *)
               &(this->author).super_field<discordpp::EmbedAuthor>,__ptr._M_head_impl);
  }
  (this->author).super_field<discordpp::EmbedAuthor>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedAuthor,_std::default_delete<discordpp::EmbedAuthor>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedAuthor_*,_std::default_delete<discordpp::EmbedAuthor>_>.
  super__Head_base<0UL,_discordpp::EmbedAuthor_*,_false>._M_head_impl = (EmbedAuthor *)0x0;
  __ptr_00._M_head_impl =
       (this->provider).super_field<discordpp::EmbedProvider>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
       .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (EmbedProvider *)0x0) {
    std::default_delete<discordpp::EmbedProvider>::operator()
              ((default_delete<discordpp::EmbedProvider> *)
               &(this->provider).super_field<discordpp::EmbedProvider>,__ptr_00._M_head_impl);
  }
  (this->provider).super_field<discordpp::EmbedProvider>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>.
  _M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
  .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl = (EmbedProvider *)0x0;
  __ptr_01._M_head_impl =
       (this->video).super_field<discordpp::EmbedVideo>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedVideo,_std::default_delete<discordpp::EmbedVideo>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedVideo_*,_std::default_delete<discordpp::EmbedVideo>_>.
       super__Head_base<0UL,_discordpp::EmbedVideo_*,_false>._M_head_impl;
  if (__ptr_01._M_head_impl != (EmbedVideo *)0x0) {
    std::default_delete<discordpp::EmbedVideo>::operator()
              ((default_delete<discordpp::EmbedVideo> *)
               &(this->video).super_field<discordpp::EmbedVideo>,__ptr_01._M_head_impl);
  }
  (this->video).super_field<discordpp::EmbedVideo>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedVideo,_std::default_delete<discordpp::EmbedVideo>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedVideo_*,_std::default_delete<discordpp::EmbedVideo>_>.
  super__Head_base<0UL,_discordpp::EmbedVideo_*,_false>._M_head_impl = (EmbedVideo *)0x0;
  __ptr_02._M_head_impl =
       (this->thumbnail).super_field<discordpp::EmbedThumbnail>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedThumbnail,_std::default_delete<discordpp::EmbedThumbnail>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedThumbnail_*,_std::default_delete<discordpp::EmbedThumbnail>_>
       .super__Head_base<0UL,_discordpp::EmbedThumbnail_*,_false>._M_head_impl;
  if (__ptr_02._M_head_impl != (EmbedThumbnail *)0x0) {
    std::default_delete<discordpp::EmbedThumbnail>::operator()
              ((default_delete<discordpp::EmbedThumbnail> *)
               &(this->thumbnail).super_field<discordpp::EmbedThumbnail>,__ptr_02._M_head_impl);
  }
  (this->thumbnail).super_field<discordpp::EmbedThumbnail>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedThumbnail,_std::default_delete<discordpp::EmbedThumbnail>_>.
  _M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedThumbnail_*,_std::default_delete<discordpp::EmbedThumbnail>_>
  .super__Head_base<0UL,_discordpp::EmbedThumbnail_*,_false>._M_head_impl = (EmbedThumbnail *)0x0;
  __ptr_03._M_head_impl =
       (this->image).super_field<discordpp::EmbedImage>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedImage_*,_std::default_delete<discordpp::EmbedImage>_>.
       super__Head_base<0UL,_discordpp::EmbedImage_*,_false>._M_head_impl;
  if (__ptr_03._M_head_impl != (EmbedImage *)0x0) {
    std::default_delete<discordpp::EmbedImage>::operator()
              ((default_delete<discordpp::EmbedImage> *)
               &(this->image).super_field<discordpp::EmbedImage>,__ptr_03._M_head_impl);
  }
  (this->image).super_field<discordpp::EmbedImage>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedImage_*,_std::default_delete<discordpp::EmbedImage>_>.
  super__Head_base<0UL,_discordpp::EmbedImage_*,_false>._M_head_impl = (EmbedImage *)0x0;
  __ptr_04._M_head_impl =
       (this->footer).super_field<discordpp::EmbedFooter>.t_._M_t.
       super___uniq_ptr_impl<discordpp::EmbedFooter,_std::default_delete<discordpp::EmbedFooter>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedFooter_*,_std::default_delete<discordpp::EmbedFooter>_>
       .super__Head_base<0UL,_discordpp::EmbedFooter_*,_false>._M_head_impl;
  if (__ptr_04._M_head_impl != (EmbedFooter *)0x0) {
    std::default_delete<discordpp::EmbedFooter>::operator()
              ((default_delete<discordpp::EmbedFooter> *)
               &(this->footer).super_field<discordpp::EmbedFooter>,__ptr_04._M_head_impl);
  }
  (this->footer).super_field<discordpp::EmbedFooter>.t_._M_t.
  super___uniq_ptr_impl<discordpp::EmbedFooter,_std::default_delete<discordpp::EmbedFooter>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedFooter_*,_std::default_delete<discordpp::EmbedFooter>_>.
  super__Head_base<0UL,_discordpp::EmbedFooter_*,_false>._M_head_impl = (EmbedFooter *)0x0;
  _Var1._M_head_impl =
       (this->color).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->color).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  _Var2._M_head_impl =
       (this->timestamp).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->timestamp).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var2._M_head_impl);
  }
  (this->timestamp).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->url).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->url).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var2._M_head_impl);
  }
  (this->url).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->description).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->description).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var2._M_head_impl);
  }
  (this->description).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->type).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->type).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var2._M_head_impl);
  }
  (this->type).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->title).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  this_00 = &(this->title).
             super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,_Var2._M_head_impl);
  }
  (this_00->t_)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       = (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  return;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}